

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::anon_unknown_2::GenerateEnumFile
               (FileDescriptor *file,EnumDescriptor *en,Options *options,
               GeneratorContext *generator_context)

{
  long lVar1;
  bool bVar2;
  int i;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  long lVar5;
  ZeroCopyOutputStream *output;
  int32 value;
  int i_1;
  long lVar6;
  string result;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  undefined1 local_220 [24];
  pointer local_208;
  pointer pbStack_200;
  _Base_ptr local_1f8;
  ZeroCopyOutputStream *local_1b8;
  GeneratorContext *local_1b0;
  string local_1a8;
  Printer printer;
  string fullname;
  string filename_1;
  string php_namespace;
  string filename;
  string newname;
  undefined4 extraout_var_00;
  
  local_1b0 = generator_context;
  FullClassName<google::protobuf::EnumDescriptor>(&result,en,options);
  for (uVar4 = 0; uVar4 < result._M_string_length; uVar4 = uVar4 + 1) {
    if (result._M_dataplus._M_p[uVar4] == '\\') {
      result._M_dataplus._M_p[uVar4] = '/';
    }
  }
  std::operator+(&filename,&result,".php");
  std::__cxx11::string::~string((string *)&result);
  iVar3 = (*local_1b0->_vptr_GeneratorContext[2])(local_1b0,&filename);
  local_1b8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3);
  io::Printer::Printer(&printer,local_1b8,'^');
  GenerateHead(file,&printer);
  FilenameToClassname(&fullname,&filename);
  lVar5 = std::__cxx11::string::find_last_of((char *)&fullname,0x3cdbbf);
  if (lVar5 << 0x20 != -0x100000000) {
    std::__cxx11::string::substr((ulong)&result,(ulong)&fullname);
    io::Printer::Print<char[5],std::__cxx11::string>
              (&printer,"namespace ^name^;\n\n",(char (*) [5])0x3de831,&result);
    std::__cxx11::string::~string((string *)&result);
    io::Printer::Print<>(&printer,"use UnexpectedValueException;\n\n");
  }
  io::Printer::Print<>(&printer,"/**\n");
  result.field_2._M_allocated_capacity = (size_type)&local_238;
  result.field_2._8_8_ = 0;
  local_238._M_local_buf[0] = '\0';
  local_228._M_p = local_220 + 8;
  local_220._0_8_ = 0;
  local_220[8] = '\0';
  local_208 = (pointer)0x0;
  pbStack_200 = (pointer)0x0;
  local_1f8 = (_Base_ptr)0x0;
  bVar2 = EnumDescriptor::GetSourceLocation(en,(SourceLocation *)&result);
  if (bVar2) {
    GenerateDocCommentBodyForLocation(&printer,(SourceLocation *)&result,true,0);
  }
  SourceLocation::~SourceLocation((SourceLocation *)&result);
  EscapePhpdoc(&result,(string *)(*(long *)(en + 8) + 0x20));
  io::Printer::Print<char[9],std::__cxx11::string>
            (&printer," * Protobuf type <code>^fullname^</code>\n */\n",(char (*) [9])"fullname",
             &result);
  std::__cxx11::string::~string((string *)&result);
  if (lVar5 << 0x20 != -0x100000000) {
    std::__cxx11::string::substr((ulong)&result,(ulong)&fullname);
    std::__cxx11::string::operator=((string *)&fullname,(string *)&result);
    std::__cxx11::string::~string((string *)&result);
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            (&printer,"class ^name^\n{\n",(char (*) [5])0x3de831,&fullname);
  Indent(&printer);
  lVar6 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(en + 4); lVar5 = lVar5 + 1) {
    lVar1 = *(long *)(en + 0x28);
    io::Printer::Print<>(&printer,"/**\n");
    result.field_2._M_allocated_capacity = (size_type)&local_238;
    result.field_2._8_8_ = 0;
    local_238._M_local_buf[0] = '\0';
    local_228._M_p = local_220 + 8;
    local_220._0_8_ = 0;
    local_220[8] = '\0';
    local_208 = (pointer)0x0;
    pbStack_200 = (pointer)0x0;
    local_1f8 = (_Base_ptr)0x0;
    bVar2 = EnumValueDescriptor::GetSourceLocation
                      ((EnumValueDescriptor *)(lVar6 + lVar1),(SourceLocation *)&result);
    if (bVar2) {
      GenerateDocCommentBodyForLocation(&printer,(SourceLocation *)&result,true,0);
    }
    SourceLocation::~SourceLocation((SourceLocation *)&result);
    EnumValueDescriptor::DebugString_abi_cxx11_
              (&php_namespace,(EnumValueDescriptor *)(lVar6 + lVar1));
    FirstLineOf(&filename_1,&php_namespace);
    EscapePhpdoc(&result,&filename_1);
    io::Printer::Print<char[4],std::__cxx11::string>
              (&printer," * Generated from protobuf enum <code>^def^</code>\n */\n",
               (char (*) [4])0x3d4ab7,&result);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&filename_1);
    std::__cxx11::string::~string((string *)&php_namespace);
    ConstantNamePrefix(&filename_1,*(string **)(lVar1 + 8 + lVar6));
    std::operator+(&result,&filename_1,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar1 + 8 + lVar6));
    (anonymous_namespace)::IntToString_abi_cxx11_
              (&php_namespace,(_anonymous_namespace_ *)(ulong)*(uint *)(lVar1 + 4 + lVar6),value);
    io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
              (&printer,"const ^name^ = ^number^;\n",(char (*) [5])0x3de831,&result,
               (char (*) [7])0x3f3265,&php_namespace);
    std::__cxx11::string::~string((string *)&php_namespace);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&filename_1);
    lVar6 = lVar6 + 0x20;
  }
  io::Printer::Print<>(&printer,"\nprivate static $valueToName = [\n");
  Indent(&printer);
  lVar5 = 8;
  for (lVar6 = 0; lVar6 < *(int *)(en + 4); lVar6 = lVar6 + 1) {
    lVar1 = *(long *)(en + 0x28);
    ConstantNamePrefix(&filename_1,*(string **)(lVar1 + lVar5));
    std::operator+(&result,&filename_1,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar1 + lVar5));
    io::Printer::Print<char[5],std::__cxx11::string>
              (&printer,"self::^name^ => \'^name^\',\n",(char (*) [5])0x3de831,&result);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&filename_1);
    lVar5 = lVar5 + 0x20;
  }
  Outdent(&printer);
  io::Printer::Print<>(&printer,"];\n");
  io::Printer::Print<>(&printer,"\npublic static function name($value)\n{\n");
  Indent(&printer);
  io::Printer::Print<>(&printer,"if (!isset(self::$valueToName[$value])) {\n");
  Indent(&printer);
  io::Printer::Print<>(&printer,"throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  io::Printer::Print<>
            (&printer,"\'Enum %s has no name defined for value %s\', __CLASS__, $value));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\nreturn self::$valueToName[$value];\n");
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\n\n");
  io::Printer::Print<>(&printer,"\npublic static function value($name)\n{\n");
  Indent(&printer);
  io::Printer::Print<>
            (&printer,"$const = __CLASS__ . \'::\' . strtoupper($name);\nif (!defined($const)) {\n")
  ;
  Indent(&printer);
  io::Printer::Print<>(&printer,"throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  io::Printer::Print<>
            (&printer,"\'Enum %s has no value defined for name %s\', __CLASS__, $name));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\nreturn constant($const);\n");
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\n");
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\n\n");
  if (*(long *)(en + 0x18) != 0) {
    io::Printer::Print<>
              (&printer,
               "// Adding a class alias for backwards compatibility with the previous class name.\n"
              );
    LegacyFullClassName<google::protobuf::EnumDescriptor>(&result,en,options);
    io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
              (&printer,"class_alias(^new^::class, \\^old^::class);\n\n",(char (*) [4])"new",
               &fullname,(char (*) [4])"old",&result);
    std::__cxx11::string::~string((string *)&result);
    LegacyFullClassName<google::protobuf::EnumDescriptor>(&result,en,options);
    for (uVar4 = 0; uVar4 < result._M_string_length; uVar4 = uVar4 + 1) {
      if (result._M_dataplus._M_p[uVar4] == '\\') {
        result._M_dataplus._M_p[uVar4] = '/';
      }
    }
    std::operator+(&filename_1,&result,".php");
    std::__cxx11::string::~string((string *)&result);
    iVar3 = (*local_1b0->_vptr_GeneratorContext[2])(local_1b0,&filename_1);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar3);
    io::Printer::Printer((Printer *)&result,output,'^');
    GenerateHead(file,(Printer *)&result);
    RootPhpNamespace<google::protobuf::EnumDescriptor>(&php_namespace,en,options);
    if (php_namespace._M_string_length != 0) {
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)&result,"namespace ^name^;\n\n",(char (*) [5])0x3de831,&php_namespace);
    }
    FullClassName<google::protobuf::EnumDescriptor>(&newname,en,options);
    io::Printer::Print<>((Printer *)&result,"if (false) {\n");
    Indent((Printer *)&result);
    io::Printer::Print<>((Printer *)&result,"/**\n");
    io::Printer::Print<char[4],std::__cxx11::string>
              ((Printer *)&result," * This class is deprecated. Use ^new^ instead.\n",
               (char (*) [4])"new",&newname);
    io::Printer::Print<>((Printer *)&result," * @deprecated\n");
    io::Printer::Print<>((Printer *)&result," */\n");
    LegacyGeneratedClassName<google::protobuf::EnumDescriptor>(&local_1a8,en);
    io::Printer::Print<char[4],std::__cxx11::string>
              ((Printer *)&result,"class ^old^ {}\n",(char (*) [4])"old",&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    Outdent((Printer *)&result);
    io::Printer::Print<>((Printer *)&result,"}\n");
    GeneratedClassNameImpl<google::protobuf::EnumDescriptor>(&local_1a8,en);
    io::Printer::Print<char[4],std::__cxx11::string>
              ((Printer *)&result,"class_exists(^new^::class);\n",(char (*) [4])"new",&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    LegacyFullClassName<google::protobuf::EnumDescriptor>(&local_1a8,en,options);
    io::Printer::Print<char[4],std::__cxx11::string,char[9],std::__cxx11::string>
              ((Printer *)&result,
               "@trigger_error(\'^old^ is deprecated and will be removed in the next major release. Use ^fullname^ instead\', E_USER_DEPRECATED);\n\n"
               ,(char (*) [4])"old",&local_1a8,(char (*) [9])"fullname",&newname);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&newname);
    std::__cxx11::string::~string((string *)&php_namespace);
    io::Printer::~Printer((Printer *)&result);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
    std::__cxx11::string::~string((string *)&filename_1);
  }
  std::__cxx11::string::~string((string *)&fullname);
  io::Printer::~Printer(&printer);
  if (local_1b8 != (ZeroCopyOutputStream *)0x0) {
    (*local_1b8->_vptr_ZeroCopyOutputStream[1])();
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void GenerateEnumFile(const FileDescriptor* file, const EnumDescriptor* en,
                      const Options& options,
                      GeneratorContext* generator_context) {
  std::string filename = GeneratedClassFileName(en, options);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != std::string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));

    // We only need this 'use' statement if the enum has a namespace.
    // Otherwise, we get a warning that the use statement has no effect.
    printer.Print("use UnexpectedValueException;\n\n");
  }

  GenerateEnumDocComment(&printer, en, options);

  if (lastindex != std::string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  printer.Print(
      "class ^name^\n"
      "{\n",
      "name", fullname);
  Indent(&printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    GenerateEnumValueDocComment(&printer, value);
    printer.Print("const ^name^ = ^number^;\n",
                  "name", ConstantNamePrefix(value->name()) + value->name(),
                  "number", IntToString(value->number()));
  }

  printer.Print("\nprivate static $valueToName = [\n");
  Indent(&printer);
  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer.Print("self::^name^ => '^name^',\n",
                  "name", ConstantNamePrefix(value->name()) + value->name());
  }
  Outdent(&printer);
  printer.Print("];\n");

  printer.Print(
      "\npublic static function name($value)\n"
      "{\n");
  Indent(&printer);
  printer.Print("if (!isset(self::$valueToName[$value])) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no name defined for value %s', __CLASS__, $value));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return self::$valueToName[$value];\n");
  Outdent(&printer);
  printer.Print("}\n\n");

  printer.Print(
      "\npublic static function value($name)\n"
      "{\n");
  Indent(&printer);
  printer.Print("$const = __CLASS__ . '::' . strtoupper($name);\n"
                "if (!defined($const)) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no value defined for name %s', __CLASS__, $name));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return constant($const);\n");
  Outdent(&printer);
  printer.Print("}\n");

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatibility with nested messages and enums
  if (en->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(en, options));
    LegacyGenerateClassFile(file, en, options, generator_context);
  }
}